

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.c
# Opt level: O3

int16_t OPL3_EnvelopeCalcSin7(uint16_t phase,uint16_t envelope)

{
  uint uVar1;
  uint uVar2;
  undefined6 in_register_00000032;
  uint uVar3;
  
  uVar3 = phase & 0x3ff;
  uVar2 = ~(uint)phase & 0x1ff;
  if (uVar3 < 0x200) {
    uVar2 = uVar3;
  }
  uVar1 = uVar2 * 8 + (int)CONCAT62(in_register_00000032,envelope) * 8;
  uVar2 = 0x1fff;
  if (uVar1 < 0x1fff) {
    uVar2 = uVar1;
  }
  return (ushort)((uint)exprom[uVar2 & 0xff] * 2 >> ((byte)(uVar2 >> 8) & 0x1f)) ^
         (uVar3 < 0x200) - 1;
}

Assistant:

static int16_t OPL3_EnvelopeCalcSin7(uint16_t phase, uint16_t envelope)
{
    uint16_t out = 0;
    uint16_t neg = 0;
    phase &= 0x3ff;
    if (phase & 0x200)
    {
        neg = 0xffff;
        phase = (phase & 0x1ff) ^ 0x1ff;
    }
    out = phase << 3;
    return OPL3_EnvelopeCalcExp(out + (envelope << 3)) ^ neg;
}